

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionSetter.cpp
# Opt level: O0

void curlpp::internal::
     OptionSetter<utilspp::Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>,_(CURLoption)20056>
     ::setOpt(CurlHandle *handle,ParamType value)

{
  Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  *in_RDI;
  CurlHandle *in_stack_ffffffffffffffd0;
  CurlHandle *this;
  CURLoption in_stack_ffffffffffffffdc;
  CurlHandle *in_stack_ffffffffffffffe0;
  undefined1 local_18 [24];
  
  local_18._16_8_ = in_RDI;
  CurlHandle::option<int(*)(curlpp::internal::CurlHandle*,double,double,double,double)>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
             (_func_int_CurlHandle_ptr_double_double_double_double *)in_stack_ffffffffffffffd0);
  CurlHandle::option<curlpp::internal::CurlHandle*>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  this = (CurlHandle *)local_18;
  utilspp::
  Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  ::Functor((Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
             *)this,(Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
                     *)local_18._16_8_);
  CurlHandle::setProgressFunctor(this,(ProgressFunctionFunctor *)local_18._16_8_);
  utilspp::
  Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  ::~Functor((Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
              *)0x150ced);
  return;
}

Assistant:

void OptionSetter<curlpp::types::ProgressFunctionFunctor, CURLOPT_PROGRESSFUNCTION>
::setOpt(internal::CurlHandle * handle, ParamType value)
{
	handle->option(CURLOPT_PROGRESSFUNCTION, Callbacks::ProgressCallback);
	handle->option(CURLOPT_PROGRESSDATA, handle);
	handle->setProgressFunctor(value);
}